

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subsat.hpp
# Opt level: O2

void __thiscall subsat::Solver::unassign(Solver *this,Lit lit)

{
  pointer pVVar1;
  
  this->m_unassigned_vars = this->m_unassigned_vars + 1;
  pVVar1 = (this->m_values).m_data.super__Vector_base<subsat::Value,_std::allocator<subsat::Value>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pVVar1[lit.m_index] = Unassigned;
  pVVar1[(ulong)lit.m_index ^ 1] = Unassigned;
  DecisionQueue::unassign(&this->m_queue,(Var)(lit.m_index >> 1));
  return;
}

Assistant:

void unassign(Lit lit)
  {
    ASS(m_unassigned_vars < m_used_vars);
    m_unassigned_vars += 1;

    ASS_EQ(m_values[lit], Value::True);
    ASS_EQ(m_values[~lit], Value::False);
    m_values[lit] = Value::Unassigned;
    m_values[~lit] = Value::Unassigned;

#if SUBSAT_VDOM
    m_vdom.unassigned(lit.var());
#endif
#if SUBSAT_VMTF
    m_queue.unassign(lit.var());
#endif
  }